

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

void __thiscall duckdb::FilterCombiner::FilterCombiner(FilterCombiner *this,Optimizer *optimizer)

{
  FilterCombiner(this,optimizer->context);
  return;
}

Assistant:

FilterCombiner::FilterCombiner(Optimizer &optimizer) : FilterCombiner(optimizer.context) {
}